

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MhsReader.cpp
# Opt level: O3

void __thiscall adios2::core::engine::MhsReader::~MhsReader(MhsReader *this)

{
  ~MhsReader(this);
  operator_delete(this);
  return;
}

Assistant:

MhsReader::~MhsReader()
{
    for (int i = 1; i < m_Tiers; ++i)
    {
        m_IO.m_ADIOS.RemoveIO("SubIO" + std::to_string(i));
    }
    if (m_IsOpen)
    {
        DestructorClose(m_FailVerbose);
    }
    m_IsOpen = false;
}